

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::record_descriptor_set_layout
          (StateRecorder *this,VkDescriptorSetLayout set_layout,
          VkDescriptorSetLayoutCreateInfo *create_info,Hash custom_hash)

{
  bool bVar1;
  mutex *__mutex;
  VkDescriptorSetLayoutCreateInfo *new_info;
  WorkItem local_50;
  
  __mutex = &this->impl->record_lock;
  std::mutex::lock(__mutex);
  new_info = (VkDescriptorSetLayoutCreateInfo *)0x0;
  bVar1 = Impl::copy_descriptor_set_layout
                    (this->impl,create_info,&this->impl->temp_allocator,&new_info);
  if (bVar1) {
    local_50.type = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
    local_50.create_info = new_info;
    local_50.handle = (uint64_t)set_layout;
    local_50.custom_hash = custom_hash;
    Impl::push_work_locked(this->impl,&local_50);
  }
  else {
    Impl::push_unregister_locked<VkDescriptorSetLayout_T*>
              (this->impl,VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,set_layout);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (bVar1) {
    Impl::pump_synchronized_recording(this->impl,this);
  }
  return bVar1;
}

Assistant:

bool StateRecorder::record_descriptor_set_layout(VkDescriptorSetLayout set_layout, const VkDescriptorSetLayoutCreateInfo &create_info,
                                                 Hash custom_hash)
{
	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkDescriptorSetLayoutCreateInfo *new_info = nullptr;
		if (!impl->copy_descriptor_set_layout(&create_info, impl->temp_allocator, &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			impl->push_unregister_locked(VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO, set_layout);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO, api_object_cast<uint64_t>(set_layout),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}